

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cpp
# Opt level: O1

int Download::ThreadDownloadFile(string *url,string *savePath)

{
  uint uVar1;
  undefined8 uVar2;
  FILE *__stream;
  longlong lVar3;
  char *pcVar4;
  
  uVar2 = curl_easy_init();
  __stream = fopen((savePath->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    memset(&msg,0,0x400);
    sprintf(&msg,"fopen %s failed",(savePath->_M_dataplus)._M_p);
    CodeLog::PrintLog("ERROR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/by415[P]Download/download.cpp"
                      ,"ThreadDownloadFile",0x52,&msg);
    uVar1 = 0xffffffff;
  }
  else {
    curl_easy_setopt(uVar2,0x2712,(url->_M_dataplus)._M_p);
    curl_easy_setopt(uVar2,0x4e2b,CallBackDownloadData);
    curl_easy_setopt(uVar2,0x2711,__stream);
    uVar1 = curl_easy_perform(uVar2);
    if (uVar1 == 0) {
      curl_easy_cleanup(uVar2);
      fclose(__stream);
      memset(&msg,0,0x400);
      sprintf(&msg,"curl_easy_perform success return val = %u",0);
      pcVar4 = "INFO";
      lVar3 = 0x61;
    }
    else {
      memset(&msg,0,0x400);
      sprintf(&msg,"curl_easy_perform failed return val = %u",(ulong)uVar1);
      pcVar4 = "ERROR";
      lVar3 = 0x5c;
    }
    CodeLog::PrintLog(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/by415[P]Download/download.cpp"
                      ,"ThreadDownloadFile",lVar3,&msg);
  }
  return uVar1;
}

Assistant:

int Download::ThreadDownloadFile(const std::string &url,const std::string &savePath)
{
    CURL *downloadHandle = curl_easy_init();
    
    FILE *outFp = NULL;
    outFp = fopen(savePath.c_str(),"wb");
    if(NULL == outFp)
    {
        LOG_ERROR("fopen %s failed",savePath.c_str());
        return -1;
    }
    curl_easy_setopt(downloadHandle,CURLOPT_URL,url.c_str());
    curl_easy_setopt(downloadHandle,CURLOPT_WRITEFUNCTION,&CallBackDownloadData);
    curl_easy_setopt(downloadHandle,CURLOPT_WRITEDATA,outFp);
    
    CURLcode res = curl_easy_perform(downloadHandle);
    if(res != CURLE_OK)
    {
        LOG_ERROR("curl_easy_perform failed return val = %u",res);
        return res;
    }
    curl_easy_cleanup(downloadHandle);	//clean up the curl handle
	fclose(outFp);	//close the file
	LOG_INFO("curl_easy_perform success return val = %u",res);
    return res;
}